

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<int>>
               (char *label_id,GetterXsYs<int> *getter,double width)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  ImPlotPlot *pIVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  ImU32 col;
  ImU32 col_00;
  long lVar13;
  ImDrawList *this;
  int iVar14;
  int iVar15;
  int iVar16;
  ImPlotRange *pIVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar12 = BeginItem(label_id,1);
  pIVar11 = GImPlot;
  if (bVar12) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      piVar8 = getter->Xs;
      piVar9 = getter->Ys;
      iVar16 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar4 = pIVar10->CurrentYAxis;
      uVar5 = (pIVar10->XAxis).Flags;
      pIVar17 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar10->YAxis[iVar4].Flags;
      iVar15 = 0;
      do {
        lVar13 = (long)(((iVar16 + iVar15) % iVar14 + iVar14) % iVar14) * (long)iVar3;
        dVar18 = (double)*(int *)((long)piVar8 + lVar13);
        iVar7 = *(int *)((long)piVar9 + lVar13);
        dVar21 = (double)iVar7;
        dVar22 = dVar18 - dVar24;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f7299:
            if ((0.0 < dVar22) || ((uVar5 & 0x20) == 0)) {
              dVar1 = (pIVar11->ExtentsX).Min;
              dVar23 = dVar22;
              if (dVar1 <= dVar22) {
                dVar23 = dVar1;
              }
              (pIVar11->ExtentsX).Min = dVar23;
              dVar1 = (pIVar11->ExtentsX).Max;
              dVar23 = dVar22;
              if (dVar22 <= dVar1) {
                dVar23 = dVar1;
              }
              (pIVar11->ExtentsX).Max = dVar23;
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar4].Range.Min <= dVar21)) &&
                (dVar21 <= pIVar10->YAxis[iVar4].Range.Max)) goto LAB_001f7299;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((0 < iVar7) || ((uVar6 & 0x20) == 0)) {
LAB_001f7301:
            dVar22 = dVar21;
            if (pIVar17->Min <= dVar21) {
              dVar22 = pIVar17->Min;
            }
            pIVar17->Min = dVar22;
            dVar22 = pIVar11->ExtentsY[iVar4].Max;
            if (dVar21 <= dVar22) {
              dVar21 = dVar22;
            }
            pIVar11->ExtentsY[iVar4].Max = dVar21;
          }
        }
        else if ((((pIVar10->XAxis).Range.Min <= dVar22) && (dVar22 <= (pIVar10->XAxis).Range.Max))
                && (local_48 = (byte)((uVar6 & 0x20) >> 5), (iVar7 < 1 & local_48) == 0))
        goto LAB_001f7301;
        dVar18 = dVar18 + dVar24;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001f7355:
            if ((0.0 < dVar18) || ((uVar5 & 0x20) == 0)) {
              dVar21 = (pIVar11->ExtentsX).Min;
              dVar22 = dVar18;
              if (dVar21 <= dVar18) {
                dVar22 = dVar21;
              }
              (pIVar11->ExtentsX).Min = dVar22;
              dVar21 = (pIVar11->ExtentsX).Max;
              dVar22 = dVar18;
              if (dVar18 <= dVar21) {
                dVar22 = dVar21;
              }
              (pIVar11->ExtentsX).Max = dVar22;
            }
          }
        }
        else if ((((long)ABS(dVar18) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar4].Range.Min <= 0.0)) &&
                (0.0 <= pIVar10->YAxis[iVar4].Range.Max)) goto LAB_001f7355;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001f73b3:
            uVar19 = 0;
            uVar20 = 0;
            dVar18 = pIVar17->Min;
            if (dVar18 <= 0.0) {
              uVar19 = SUB84(dVar18,0);
              uVar20 = (undefined4)((ulong)dVar18 >> 0x20);
            }
            pIVar17->Min = (double)CONCAT44(uVar20,uVar19);
            uVar19 = 0;
            uVar20 = 0;
            dVar18 = pIVar11->ExtentsY[iVar4].Max;
            if (0.0 <= dVar18) {
              uVar19 = SUB84(dVar18,0);
              uVar20 = (undefined4)((ulong)dVar18 >> 0x20);
            }
            pIVar11->ExtentsY[iVar4].Max = (double)CONCAT44(uVar20,uVar19);
          }
        }
        else if ((((uVar6 & 0x20) == 0) && ((pIVar10->XAxis).Range.Min <= dVar18)) &&
                (dVar18 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f73b3;
        iVar15 = iVar15 + 1;
      } while (iVar14 != iVar15);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar11->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar12 = (pIVar11->NextItemData).RenderFill;
      bVar2 = (pIVar11->NextItemData).RenderLine;
      iVar16 = 0;
      do {
        lVar13 = (long)(((getter->Offset + iVar16) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        iVar14 = *(int *)((long)getter->Ys + lVar13);
        if (iVar14 != 0) {
          dVar18 = (double)*(int *)((long)getter->Xs + lVar13);
          local_38 = PlotToPixels(dVar18 - dVar24,(double)iVar14,-1);
          local_40 = PlotToPixels(dVar18 + dVar24,0.0,-1);
          if ((pIVar11->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar12 ^ 1U | col != col_00) & bVar2) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar11->NextItemData).LineWeight);
          }
        }
        iVar16 = iVar16 + 1;
        iVar14 = getter->Count;
      } while (iVar16 < iVar14);
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}